

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupTestMemoryAccountant::~TEST_GROUP_CppUTestGroupTestMemoryAccountant
          (TEST_GROUP_CppUTestGroupTestMemoryAccountant *this)

{
  ~TEST_GROUP_CppUTestGroupTestMemoryAccountant(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_GROUP(TestMemoryAccountant)
{
    MemoryAccountant accountant;
    TestTestingFixture fixture;
    MemoryAccountantExecFunction testFunction;

    void setup() _override
    {
        testFunction.parameter_ = &accountant;
        fixture.setTestFunction(&testFunction);
    }

    void teardown() _override
    {
        accountant.clear();
    }
}